

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_2::ImageViewTest::createInstance(ImageViewTest *this,Context *context)

{
  ImageSamplingInstance *this_00;
  undefined1 local_98 [8];
  VkSamplerCreateInfo samplerParams;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> vertices;
  int arraySize;
  IVec3 imageSize;
  UVec2 renderSize;
  Context *context_local;
  ImageViewTest *this_local;
  
  getRenderSize((ImageViewTest *)(imageSize.m_data + 1),this->m_imageViewType);
  getImageSize((ImageViewTest *)
               ((long)&vertices.
                       super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),this->m_imageViewType
              );
  vertices.
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = getArraySize(this->m_imageViewType);
  createTestQuadMosaic
            ((vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)
             &samplerParams.borderColor,this->m_imageViewType);
  local_98._0_4_ = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  samplerParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  samplerParams._4_4_ = 0;
  samplerParams.pNext._0_4_ = 0;
  samplerParams.pNext._4_4_ = 0;
  samplerParams.flags = 0;
  samplerParams.magFilter = VK_FILTER_NEAREST;
  samplerParams.minFilter = 2;
  samplerParams.mipmapMode = VK_SAMPLER_MIPMAP_MODE_LAST;
  samplerParams.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  samplerParams.addressModeV = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  samplerParams.addressModeW = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  samplerParams.mipLodBias = 1.0;
  samplerParams.anisotropyEnable = 0;
  samplerParams.maxAnisotropy = 0.0;
  samplerParams.compareEnable = 0;
  samplerParams.compareOp = (VkCompareOp)(float)((this->m_subresourceRange).levelCount - 1);
  samplerParams.minLod =
       (float)getFormatBorderColor(BORDER_COLOR_TRANSPARENT_BLACK,this->m_imageFormat);
  samplerParams.maxLod = 0.0;
  this_00 = (ImageSamplingInstance *)operator_new(0x348);
  ImageSamplingInstance::ImageSamplingInstance
            (this_00,context,(UVec2 *)(imageSize.m_data + 1),this->m_imageViewType,
             this->m_imageFormat,
             (IVec3 *)((long)&vertices.
                              super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (int)vertices.
                  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_componentMapping,
             &this->m_subresourceRange,(VkSamplerCreateInfo *)local_98,this->m_samplerLod,
             (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)
             &samplerParams.borderColor,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
  std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::~vector
            ((vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)
             &samplerParams.borderColor);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* ImageViewTest::createInstance (Context& context) const
{
	const tcu::UVec2				renderSize		= getRenderSize(m_imageViewType);
	const tcu::IVec3				imageSize		= getImageSize(m_imageViewType);
	const int						arraySize		= getArraySize(m_imageViewType);
	const std::vector<Vertex4Tex4>	vertices		= createTestQuadMosaic(m_imageViewType);

	const VkSamplerCreateInfo		samplerParams	=
	{
		VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,									// VkStructureType			sType;
		DE_NULL,																// const void*				pNext;
		0u,																		// VkSamplerCreateFlags		flags;
		VK_FILTER_NEAREST,														// VkFilter					magFilter;
		VK_FILTER_NEAREST,														// VkFilter					minFilter;
		VK_SAMPLER_MIPMAP_MODE_NEAREST,											// VkSamplerMipmapMode		mipmapMode;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeU;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeV;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeW;
		0.0f,																	// float					mipLodBias;
		VK_FALSE,																// VkBool32					anisotropyEnable;
		1.0f,																	// float					maxAnisotropy;
		false,																	// VkBool32					compareEnable;
		VK_COMPARE_OP_NEVER,													// VkCompareOp				compareOp;
		0.0f,																	// float					minLod;
		(float)(m_subresourceRange.levelCount - 1),								// float					maxLod;
		getFormatBorderColor(BORDER_COLOR_TRANSPARENT_BLACK, m_imageFormat),	// VkBorderColor			borderColor;
		false																	// VkBool32					unnormalizedCoordinates;
	};

	return new ImageSamplingInstance(context, renderSize, m_imageViewType, m_imageFormat, imageSize, arraySize, m_componentMapping, m_subresourceRange, samplerParams, m_samplerLod, vertices);
}